

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigFeed.c
# Opt level: O0

int Fraig_GetSmallestColumn(int *pHits,int nHits)

{
  int local_28;
  int local_24;
  int nHitsMin;
  int iColMin;
  int i;
  int nHits_local;
  int *pHits_local;
  
  local_24 = -1;
  local_28 = 1000000;
  nHitsMin = 0;
  do {
    if (nHits <= nHitsMin) {
      return local_24;
    }
    if (pHits[nHitsMin] != 0) {
      if (pHits[nHitsMin] == 1) {
        return nHitsMin;
      }
      if (pHits[nHitsMin] < local_28) {
        local_28 = pHits[nHitsMin];
        local_24 = nHitsMin;
      }
    }
    nHitsMin = nHitsMin + 1;
  } while( true );
}

Assistant:

int Fraig_GetSmallestColumn( int * pHits, int nHits )
{
    int i, iColMin = -1, nHitsMin = 1000000;
    for ( i = 0; i < nHits; i++ )
    {
        // skip covered columns
        if ( pHits[i] == 0 )
            continue;
        // take the column if it can only be covered by one pattern
        if ( pHits[i] == 1 )
            return i;
        // find the column, which requires the smallest number of patterns
        if ( nHitsMin > pHits[i] )
        {
            nHitsMin = pHits[i];
            iColMin = i;
        }
    }
    return iColMin;
}